

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractDOMParser.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractDOMParser::setExternalNoNamespaceSchemaLocation
          (AbstractDOMParser *this,XMLCh *noNamespaceSchemaLocation)

{
  XMLCh *noNamespaceSchemaLocation_local;
  AbstractDOMParser *this_local;
  
  XMLScanner::setExternalNoNamespaceSchemaLocation(this->fScanner,noNamespaceSchemaLocation);
  return;
}

Assistant:

void AbstractDOMParser::setExternalNoNamespaceSchemaLocation(const XMLCh* const noNamespaceSchemaLocation)
{
    fScanner->setExternalNoNamespaceSchemaLocation(noNamespaceSchemaLocation);
}